

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O3

Token __thiscall
trieste::wf::Gen::choose
          (Gen *this,vector<trieste::Token,_std::allocator<trieste::Token>_> *tokens,size_t depth)

{
  double dVar1;
  __normal_iterator<const_trieste::Token_*,_std::vector<trieste::Token,_std::allocator<trieste::Token>_>_>
  __first;
  __normal_iterator<const_trieste::Token_*,_std::vector<trieste::Token,_std::allocator<trieste::Token>_>_>
  __last;
  pointer pTVar2;
  result_type rVar3;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  TokenDef *pTVar7;
  anon_class_16_2_f7aa0bb0 __unary_op;
  vector<double,_std::allocator<double>_> offsets;
  double *local_38;
  double *pdStack_30;
  long local_28;
  size_t local_18;
  
  __first._M_current =
       (tokens->super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (tokens->super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if ((long)__last._M_current - (long)__first._M_current == 8) {
    pTVar7 = (__first._M_current)->def;
  }
  else {
    local_18 = depth;
    if (this->target_depth < depth) {
      local_38 = (double *)0x0;
      pdStack_30 = (double *)0x0;
      local_28 = 0;
      __unary_op.depth = &local_18;
      __unary_op.this = this;
      std::
      transform<__gnu_cxx::__normal_iterator<trieste::Token_const*,std::vector<trieste::Token,std::allocator<trieste::Token>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>,trieste::wf::Gen::choose(std::vector<trieste::Token,std::allocator<trieste::Token>>const&,unsigned_long)::_lambda(trieste::Token_const&)_1_>
                (__first,__last,(vector<double,_std::allocator<double>_> *)&local_38,__unary_op);
      if ((local_38 != pdStack_30) && (pdVar5 = local_38 + 1, pdVar5 != pdStack_30)) {
        dVar1 = *local_38;
        do {
          dVar1 = dVar1 + *pdVar5;
          *pdVar5 = dVar1;
          pdVar5 = pdVar5 + 1;
        } while (pdVar5 != pdStack_30);
      }
      rVar3 = xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>::
              operator()(&this->rand);
      uVar6 = (long)pdStack_30 - (long)local_38 >> 3;
      pdVar5 = local_38;
      if (0 < (long)uVar6) {
        dVar1 = ((double)rVar3 / 4294967295.0) * pdStack_30[-1];
        do {
          uVar4 = uVar6 >> 1;
          if (pdVar5[uVar4] <= dVar1 && dVar1 != pdVar5[uVar4]) {
            pdVar5 = pdVar5 + uVar4 + 1;
            uVar4 = ~uVar4 + uVar6;
          }
          uVar6 = uVar4;
        } while (0 < (long)uVar4);
      }
      pTVar7 = *(TokenDef **)
                ((long)pdVar5 +
                ((long)(tokens->super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>)
                       ._M_impl.super__Vector_impl_data._M_start - (long)local_38));
      if (local_38 != (double *)0x0) {
        operator_delete(local_38,local_28 - (long)local_38);
      }
    }
    else {
      rVar3 = xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>::
              operator()(&this->rand);
      pTVar2 = (tokens->super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pTVar7 = pTVar2[(ulong)rVar3 %
                      (ulong)((long)(tokens->
                                    super__Vector_base<trieste::Token,_std::allocator<trieste::Token>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3)
                     ].def;
    }
  }
  return (Token)pTVar7;
}

Assistant:

Token choose(const std::vector<Token>& tokens, std::size_t depth)
      {
        if (tokens.size() == 1)
        {
          return tokens[0];
        }

        if (depth <= target_depth)
        {
          std::size_t choice = rand() % tokens.size();
          return tokens[choice];
        }

        // compute 1 / (1 + alpha * (depth - target_depth) * distance)
        std::vector<double> offsets;
        std::transform(
          tokens.begin(),
          tokens.end(),
          std::back_inserter(offsets),
          [&](const Token& t) {
            if (
              token_terminal_distance.find(t) != token_terminal_distance.end())
            {
              std::size_t distance = token_terminal_distance.at(t);
              return 1.0 / (1.0 + (alpha * (depth - target_depth) * distance));
            }
            else
            {
              std::ostringstream err;
              err << "Token " << t.str()
                  << " not found in token_terminal_distance map" << std::endl;
              err << "{";
              std::string delim = "";
              for (auto const& [key, val] : token_terminal_distance)
              {
                err << delim << key.str() << ":" << val;
                delim = ", ";
              }
              err << "}" << std::endl;
              throw std::runtime_error(err.str());
            }
          });

        // compute the cumulative distribution of P(d | c, p)
        std::partial_sum(offsets.begin(), offsets.end(), offsets.begin());

        // instead of normalizing the cumulative distribution, scale the random
        // number to the sum of the probabilities
        double value = static_cast<double>(rand() - rand.min()) /
          static_cast<double>(rand.max() - rand.min()) * offsets.back();

        // finding the first element greater than the uniform random number is
        // the same as performing a weighted sampling of the P(c | d, p)
        // distribution
        auto it = std::lower_bound(offsets.begin(), offsets.end(), value);

        return tokens[std::distance(offsets.begin(), it)];
      }